

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom
          (WordEmbedding *this,WordEmbedding *from)

{
  ulong uVar1;
  LogMessage *other;
  undefined8 *puVar2;
  ulong uVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/WordEmbedding.pb.cc"
               ,0x104);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar3 = (ulong)(from->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->language_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->modelparameterdata_,uVar3,puVar2);
  }
  if (from->revision_ != 0) {
    this->revision_ = from->revision_;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void WordEmbedding::MergeFrom(const WordEmbedding& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_language().empty()) {
    _internal_set_language(from._internal_language());
  }
  if (!from._internal_modelparameterdata().empty()) {
    _internal_set_modelparameterdata(from._internal_modelparameterdata());
  }
  if (from._internal_revision() != 0) {
    _internal_set_revision(from._internal_revision());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}